

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_arm.c
# Opt level: O0

void v7m_msr_xpsr(CPUARMState_conflict *env,uint32_t mask,uint32_t reg,uint32_t val)

{
  int iVar1;
  undefined4 local_20;
  uint32_t apsrmask;
  uint32_t val_local;
  uint32_t reg_local;
  uint32_t mask_local;
  CPUARMState_conflict *env_local;
  
  if ((reg & 4) == 0) {
    local_20 = 0;
    if ((mask & 8) != 0) {
      local_20 = 0xf8000000;
    }
    if ((mask & 4) != 0) {
      iVar1 = arm_feature(env,0x22);
      if (iVar1 != 0) {
        local_20 = local_20 | 0xf0000;
      }
    }
    xpsr_write(env,val,local_20);
  }
  return;
}

Assistant:

static void v7m_msr_xpsr(CPUARMState *env, uint32_t mask, uint32_t reg,
                         uint32_t val)
{
    uint32_t xpsrmask = 0;

    if (reg & 1) {
        xpsrmask |= XPSR_EXCP;
    }

    if (!(reg & 4)) {
        if (mask & 8) {
            xpsrmask |= XPSR_NZCV | XPSR_Q;
        }
        if ((mask & 4) && arm_feature(env, ARM_FEATURE_THUMB_DSP)) {
            xpsrmask |= XPSR_GE;
        }
    }

    if (reg & 2) {
        xpsrmask |= (XPSR_IT_0_1 | XPSR_IT_2_7 | XPSR_T);
    }

    xpsr_write(env, val, xpsrmask);
}